

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O2

void __thiscall
xray_re::xr_reader::
r_seq<std::vector<xray_re::wm_object,std::allocator<xray_re::wm_object>>,read_wallmark>
          (xr_reader *this,size_type n,
          vector<xray_re::wm_object,_std::allocator<xray_re::wm_object>_> *container)

{
  bool bVar1;
  read_wallmark local_89;
  wm_object local_88;
  
  std::vector<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>::reserve(container,n);
  while (bVar1 = n != 0, n = n - 1, bVar1) {
    local_88.vertices.super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.vertices.super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.height = 0.0;
    local_88.rotate = 0.0;
    local_88.vertices.super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.bsphere.p.field_0._4_8_ = 0;
    local_88.bsphere.r = 0.0;
    local_88.width = 0.0;
    local_88.bbox.field_0._12_8_ = 0;
    local_88._24_8_ = 0;
    local_88._0_8_ = 0;
    local_88.bbox.field_0._4_8_ = 0;
    std::vector<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>::
    emplace_back<xray_re::wm_object>(container,&local_88);
    std::_Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>::~_Vector_base
              (&local_88.vertices.
                super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>);
    read_wallmark::operator()
              (&local_89,
               (container->
               super__Vector_base<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>)._M_impl.
               super__Vector_impl_data._M_finish + -1,this);
  }
  return;
}

Assistant:

inline void xr_reader::r_seq(size_t n, T& container, F read)
{
	container.reserve(n);
	while (n--) {
		container.push_back(typename T::value_type());
		read(container.back(), *this);
	}
}